

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O3

void pack_table(void)

{
  Yshort *pYVar1;
  Yshort **__ptr;
  Yshort **__ptr_00;
  uint uVar2;
  Yshort YVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  
  base = (Yshort *)allocate(nvectors << 2);
  pos = (Yshort *)allocate(nentries << 2);
  maxtable = 1000;
  table = (Yshort *)allocate(4000);
  check = (Yshort *)allocate(maxtable << 2);
  lowzero = 0;
  high = 0;
  if (0 < (long)maxtable) {
    memset(check,0xff,(long)maxtable << 2);
  }
  if (0 < nentries) {
    lVar4 = 0;
    iVar5 = nentries;
    do {
      uVar2 = matching_vector((int)lVar4);
      if ((int)uVar2 < 0) {
        YVar3 = pack_vector((int)lVar4);
        iVar5 = nentries;
      }
      else {
        YVar3 = base[uVar2];
      }
      pYVar1 = base;
      pos[lVar4] = YVar3;
      pYVar1[order[lVar4]] = YVar3;
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar5);
  }
  __ptr_00 = tos;
  __ptr = froms;
  lVar4 = (long)nvectors;
  if (0 < lVar4) {
    lVar6 = 0;
    do {
      pYVar1 = __ptr[lVar6];
      if (pYVar1 != (Yshort *)0x0) {
        free(pYVar1);
      }
      pYVar1 = __ptr_00[lVar6];
      if (pYVar1 != (Yshort *)0x0) {
        free(pYVar1);
      }
      lVar6 = lVar6 + 1;
    } while (lVar4 != lVar6);
  }
  free(__ptr);
  free(__ptr_00);
  free(tally);
  free(width);
  free(pos);
  return;
}

Assistant:

void pack_table()
{
    register int i;
    register int place;
    register int state;

    base = NEW2(nvectors, Yshort);
    pos = NEW2(nentries, Yshort);

    maxtable = 1000;
    table = NEW2(maxtable, Yshort);
    check = NEW2(maxtable, Yshort);

    lowzero = 0;
    high = 0;

    for (i = 0; i < maxtable; i++)
	check[i] = -1;

    for (i = 0; i < nentries; i++)
    {
	state = matching_vector(i);

	if (state < 0)
	    place = pack_vector(i);
	else
	    place = base[state];

	pos[i] = place;
	base[order[i]] = place;
    }

    for (i = 0; i < nvectors; i++)
    {
	if (froms[i])
	    FREE(froms[i]);
	if (tos[i])
	    FREE(tos[i]);
    }

    FREE(froms);
    FREE(tos);
    FREE(tally);
    FREE(width);
    FREE(pos);
}